

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdjpeg.c
# Opt level: O0

boolean keymatch(char *arg,char *keyword,int minchars)

{
  char cVar1;
  ushort **ppuVar2;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  int nmatched;
  int ck;
  int ca;
  int local_28;
  int local_20;
  char *local_18;
  char *local_10;
  uint local_4;
  
  local_28 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    local_20 = (int)*local_10;
    if (local_20 == 0) {
      local_4 = (uint)(in_EDX <= local_28);
      return local_4;
    }
    cVar1 = *local_18;
    if (cVar1 == 0) break;
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[local_20] & 0x100) != 0) {
      local_20 = tolower(local_20);
    }
    if (local_20 != cVar1) {
      return 0;
    }
    local_28 = local_28 + 1;
    local_18 = local_18 + 1;
    local_10 = local_10 + 1;
  }
  return 0;
}

Assistant:

GLOBAL(boolean)
keymatch(char *arg, const char *keyword, int minchars)
{
  register int ca, ck;
  register int nmatched = 0;

  while ((ca = *arg++) != '\0') {
    if ((ck = *keyword++) == '\0')
      return FALSE;             /* arg longer than keyword, no good */
    if (isupper(ca))            /* force arg to lcase (assume ck is already) */
      ca = tolower(ca);
    if (ca != ck)
      return FALSE;             /* no good */
    nmatched++;                 /* count matched characters */
  }
  /* reached end of argument; fail if it's too short for unique abbrev */
  if (nmatched < minchars)
    return FALSE;
  return TRUE;                  /* A-OK */
}